

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

int LiteScript::Syntax::ReadOperator
              (char *text,
              vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              *op,bool *need_value,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  byte bVar1;
  pointer pIVar2;
  pointer pIVar3;
  pointer pIVar4;
  pointer pIVar5;
  bool bVar6;
  ErrorType *pEVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  pointer pOVar11;
  ulong uVar12;
  ulong uVar13;
  uint *errorType_00;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *errorType_01;
  uint i_3;
  uint i;
  uint uVar14;
  Operators OVar15;
  uint i_4;
  Syntax *this;
  uint i_1;
  string name;
  string local_70;
  int local_4c;
  ErrorType *local_48;
  Instruction local_40;
  
  *need_value = true;
  bVar1 = *text;
  if (0x5a < bVar1) {
    if (bVar1 != 0x5b) {
      if (bVar1 == 0x5e) {
        OVar15 = OP_BIT_XOR;
      }
      else {
        if (bVar1 != 0x7c) goto switchD_0013885c_caseD_22;
        if (text[1] == '|') {
          OVar15 = OP_OR;
          goto LAB_00138ffe;
        }
        OVar15 = OP_BIT_OR;
      }
      goto LAB_00139019;
    }
    pOVar11 = (op->
              super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    errorType_01 = instrl;
    if (pOVar11 !=
        (op->
        super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (OP_Priority[pOVar11[-1]] != '\x01') break;
        PopOperator(op,instrl);
        pOVar11 = (op->
                  super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      } while (pOVar11 !=
               (op->
               super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
               )._M_impl.super__Vector_impl_data._M_start);
    }
    uVar13 = 0;
    while( true ) {
      while( true ) {
        uVar14 = (uint)uVar13;
        if ((0x20 < (ulong)(byte)text[uVar13 + 1]) ||
           ((0x100000600U >> ((ulong)(byte)text[uVar13 + 1] & 0x3f) & 1) == 0)) break;
        uVar13 = (ulong)(uVar14 + 1);
      }
      uVar9 = ReadComment(text + uVar13 + 1);
      if (uVar9 == 0) break;
      uVar13 = (ulong)(uVar14 + uVar9);
    }
    iVar10 = ReadExpression((Syntax *)(text + (long)(int)uVar14 + 1),(char *)instrl,
                            (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                             *)errorType,(ErrorType *)errorType_01);
    if (iVar10 < 1) {
      if (iVar10 != 0) {
        return iVar10 - (uVar14 + 1);
      }
      *errorType = SCRPT_ERROR_EXPRESSION;
      return ~uVar14;
    }
    iVar10 = iVar10 + uVar14 + 1;
    uVar14 = 0;
    while( true ) {
      while( true ) {
        if ((0x20 < (ulong)(byte)text[(ulong)uVar14 + (long)iVar10]) ||
           ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar14 + (long)iVar10] & 0x3f) & 1) == 0))
        break;
        uVar14 = uVar14 + 1;
      }
      uVar9 = ReadComment(text + (ulong)uVar14 + (long)iVar10);
      if (uVar9 == 0) break;
      uVar14 = uVar14 + uVar9;
    }
    iVar10 = uVar14 + iVar10;
    if (text[iVar10] == ']') {
      Instruction::Instruction((Instruction *)&local_70,INSTR_OP_ARRAY);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_70);
      goto LAB_001390da;
    }
    *errorType = SCRPT_ERROR_BRACKET_CLOSE;
    goto LAB_001390b9;
  }
  errorType_00 = &switchD_0013885c::switchdataD_001441fc;
  switch(bVar1) {
  case 0x21:
    if (text[1] != '=') {
      *errorType = SCRPT_ERROR_OPERATOR;
      return 0xffffffff;
    }
    OVar15 = OP_DIF;
    break;
  default:
switchD_0013885c_caseD_22:
    *need_value = false;
    return 0;
  case 0x25:
    OVar15 = OP_MOD;
LAB_00139019:
    PushOperator(op,OVar15,instrl);
    return 1;
  case 0x26:
    if (text[1] != '&') {
      OVar15 = OP_BIT_AND;
      goto LAB_00139019;
    }
    OVar15 = OP_AND;
    break;
  case 0x28:
    pOVar11 = (op->
              super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pOVar11 !=
        (op->
        super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (OP_Priority[pOVar11[-1]] != '\x01') break;
        PopOperator(op,instrl);
        pOVar11 = (op->
                  super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      } while (pOVar11 !=
               (op->
               super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
               )._M_impl.super__Vector_impl_data._M_start);
    }
    Instruction::Instruction((Instruction *)&local_70,INSTR_PUSH_ARGS);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_70);
    Instruction::~Instruction((Instruction *)&local_70);
    local_4c = 0;
    if (text[1] == ')') {
      iVar10 = 1;
      bVar6 = false;
    }
    else {
      this = (Syntax *)(text + 1);
      bVar6 = true;
      iVar10 = 1;
      local_48 = (ErrorType *)text;
      do {
        uVar14 = 0;
        while( true ) {
          while( true ) {
            if ((0x20 < (ulong)(byte)this[uVar14]) ||
               ((0x100000600U >> ((ulong)(byte)this[uVar14] & 0x3f) & 1) == 0)) break;
            uVar14 = uVar14 + 1;
          }
          uVar9 = ReadComment((char *)(this + uVar14));
          if (uVar9 == 0) break;
          uVar14 = uVar14 + uVar9;
        }
        if (uVar14 == 0) {
          uVar14 = 0;
          if ((bVar6) &&
             (uVar14 = ReadExpression(this,(char *)instrl,
                                      (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                       *)errorType,errorType_00), iVar8 = local_4c, 0 < (int)uVar14)
             ) {
            Instruction::Instruction((Instruction *)&local_70,INSTR_DEFINE_ARG,local_4c);
            std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
            emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_70);
            local_4c = iVar8 + 1;
            Instruction::~Instruction((Instruction *)&local_70);
            bVar6 = false;
          }
          else {
            if ((int)uVar14 < 0) {
              return uVar14 - iVar10;
            }
            if ((bVar6) || (*this != (Syntax)0x2c)) {
              *errorType = SCRPT_ERROR_PARENTHESIS_CLOSE;
              return -iVar10;
            }
            uVar14 = 1;
            bVar6 = true;
          }
        }
        iVar10 = uVar14 + iVar10;
        this = (Syntax *)((long)local_48 + (long)iVar10);
        errorType_00 = local_48;
      } while (*(char *)((long)local_48 + (long)iVar10) != ')');
      bVar6 = (bool)(bVar6 & 0 < local_4c);
    }
    if (!bVar6) {
      pOVar11 = (op->
                super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((pOVar11 ==
           (op->
           super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
           )._M_impl.super__Vector_impl_data._M_start) || (pOVar11[-1] != OP_NEW)) {
        Instruction::Instruction((Instruction *)&local_70,INSTR_OP_CALL);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_70);
      }
      else {
        (op->
        super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
        )._M_impl.super__Vector_impl_data._M_finish = pOVar11 + -1;
        Instruction::Instruction((Instruction *)&local_70,INSTR_VALUE_OBJECT);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_70);
      }
LAB_001390da:
      Instruction::~Instruction((Instruction *)&local_70);
      *need_value = false;
      return iVar10 + 1;
    }
    goto LAB_00138f63;
  case 0x2a:
    if (text[1] != '=') {
      OVar15 = OP_MUL;
      goto LAB_00139019;
    }
    OVar15 = OP_MUL_ASSIGN;
    break;
  case 0x2b:
    if (text[1] != '=') {
      OVar15 = OP_ADD;
      goto LAB_00139019;
    }
    OVar15 = OP_ADD_ASSIGN;
    break;
  case 0x2d:
    if (text[1] != '=') {
      OVar15 = OP_SUB;
      goto LAB_00139019;
    }
    OVar15 = OP_SUB_ASSIGN;
    break;
  case 0x2e:
    pOVar11 = (op->
              super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pOVar11 !=
        (op->
        super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (OP_Priority[pOVar11[-1]] != '\x01') break;
        PopOperator(op,instrl);
        pOVar11 = (op->
                  super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      } while (pOVar11 !=
               (op->
               super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
               )._M_impl.super__Vector_impl_data._M_start);
    }
    uVar14 = 0;
    while( true ) {
      while( true ) {
        if ((0x20 < (ulong)(byte)text[(ulong)uVar14 + 1]) ||
           ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar14 + 1] & 0x3f) & 1) == 0)) break;
        uVar14 = uVar14 + 1;
      }
      uVar9 = ReadComment(text + (ulong)uVar14 + 1);
      if (uVar9 == 0) break;
      uVar14 = uVar14 + uVar9;
    }
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    uVar9 = ReadName(text + (long)(int)uVar14 + 1,&local_70);
    if (uVar9 == 0) {
      *errorType = SCRPT_ERROR_NAME;
      uVar9 = ~uVar14;
    }
    else {
      Instruction::Instruction(&local_40,INSTR_OP_MEMBER,local_70._M_dataplus._M_p);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(instrl,&local_40);
      uVar9 = uVar14 + 1 + uVar9;
      Instruction::~Instruction(&local_40);
      *need_value = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return uVar9;
    }
    operator_delete(local_70._M_dataplus._M_p);
    return uVar9;
  case 0x2f:
    if (text[1] != '=') {
      OVar15 = OP_DIV;
      goto LAB_00139019;
    }
    OVar15 = OP_DIV_ASSIGN;
    break;
  case 0x3c:
    if (text[1] == '<') {
      OVar15 = OP_LSHIFT;
    }
    else {
      if (text[1] != '=') {
        OVar15 = OP_LESS;
        goto LAB_00139019;
      }
      OVar15 = OP_LESS_EQU;
    }
    break;
  case 0x3d:
    if (text[1] != '=') {
      OVar15 = OP_ASSIGN;
      goto LAB_00139019;
    }
    OVar15 = OP_EQU;
    break;
  case 0x3e:
    if (text[1] == '>') {
      OVar15 = OP_RSHIFT;
    }
    else {
      if (text[1] != '=') {
        OVar15 = OP_GREAT;
        goto LAB_00139019;
      }
      OVar15 = OP_GREAT_EQU;
    }
    break;
  case 0x3f:
    pOVar11 = (op->
              super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pOVar11 !=
        (op->
        super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (OP_Priority[pOVar11[-1]] != OP_Priority[0x1e]) break;
        PopOperator(op,instrl);
        pOVar11 = (op->
                  super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      } while (pOVar11 !=
               (op->
               super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
               )._M_impl.super__Vector_impl_data._M_start);
    }
    pIVar2 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pIVar3 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar14 = 0;
    local_48 = (ErrorType *)text;
    while( true ) {
      while( true ) {
        if ((0x20 < (ulong)(byte)text[(ulong)uVar14 + 1]) ||
           ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar14 + 1] & 0x3f) & 1) == 0)) break;
        uVar14 = uVar14 + 1;
      }
      uVar9 = ReadComment(text + (ulong)uVar14 + 1);
      if (uVar9 == 0) break;
      uVar14 = uVar14 + uVar9;
    }
    Instruction::Instruction((Instruction *)&local_70,INSTR_JUMP_ELSE);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_70);
    iVar10 = uVar14 + 1;
    Instruction::~Instruction((Instruction *)&local_70);
    pEVar7 = local_48;
    iVar8 = ReadExpression((Syntax *)((long)local_48 + (long)iVar10),(char *)instrl,
                           (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                            *)errorType,errorType_00);
    if (iVar8 < 1) {
      if (iVar8 != 0) {
        return iVar8 - iVar10;
      }
      *errorType = SCRPT_ERROR_EXPRESSION;
      return ~uVar14;
    }
    iVar8 = iVar8 + iVar10;
    uVar13 = 0;
    while( true ) {
      while( true ) {
        iVar10 = (int)uVar13;
        uVar12 = (ulong)*(byte *)((long)pEVar7 + uVar13 + (long)iVar8);
        if ((0x20 < uVar12) || ((0x100000600U >> (uVar12 & 0x3f) & 1) == 0)) break;
        uVar13 = (ulong)(iVar10 + 1);
      }
      uVar14 = ReadComment((char *)((long)pEVar7 + uVar13 + (long)iVar8));
      if (uVar14 == 0) break;
      uVar13 = (ulong)(iVar10 + uVar14);
    }
    pIVar4 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar5 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_start;
    Instruction::Instruction((Instruction *)&local_70,INSTR_JUMP_TO);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_70);
    Instruction::~Instruction((Instruction *)&local_70);
    Instruction::Instruction
              ((Instruction *)&local_70,INSTR_JUMP_ELSE,
               (int)((ulong)((long)(instrl->
                                   super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(instrl->
                                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4));
    Instruction::operator=
              ((Instruction *)
               (&((instrl->
                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                  )._M_impl.super__Vector_impl_data._M_start)->code +
               (((long)pIVar3 - (long)pIVar2) * 0x10000000 >> 0x1c)),(Instruction *)&local_70);
    iVar10 = iVar10 + iVar8;
    Instruction::~Instruction((Instruction *)&local_70);
    pEVar7 = local_48;
    if (*(char *)((long)local_48 + (long)iVar10) != ':') {
      *errorType = SCRPT_ERROR_COLON;
      return -iVar10;
    }
    uVar14 = 0;
    while( true ) {
      while( true ) {
        uVar13 = (ulong)*(byte *)((long)pEVar7 + (ulong)uVar14 + (long)iVar10);
        if ((0x20 < uVar13) || ((0x100000600U >> (uVar13 & 0x3f) & 1) == 0)) break;
        uVar14 = uVar14 + 1;
      }
      uVar9 = ReadComment((char *)((long)pEVar7 + (ulong)uVar14 + (long)iVar10));
      if (uVar9 == 0) break;
      uVar14 = uVar14 + uVar9;
    }
    iVar10 = uVar14 + iVar10;
    iVar8 = ReadExpression((Syntax *)((long)local_48 + (long)iVar10),(char *)instrl,
                           (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                            *)errorType,errorType_00);
    if (0 < iVar8) {
      Instruction::Instruction
                ((Instruction *)&local_70,INSTR_JUMP_TO,
                 (int)((ulong)((long)(instrl->
                                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(instrl->
                                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 4));
      Instruction::operator=
                ((Instruction *)
                 (&((instrl->
                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                    )._M_impl.super__Vector_impl_data._M_start)->code +
                 (((long)pIVar4 - (long)pIVar5) * 0x10000000 >> 0x1c)),(Instruction *)&local_70);
      Instruction::~Instruction((Instruction *)&local_70);
      return iVar8 + iVar10;
    }
    if (iVar8 != 0) {
      return iVar8 - iVar10;
    }
LAB_00138f63:
    *errorType = SCRPT_ERROR_EXPRESSION;
LAB_001390b9:
    return -iVar10;
  }
LAB_00138ffe:
  PushOperator(op,OVar15,instrl);
  return 2;
}

Assistant:

int LiteScript::Syntax::ReadOperator(const char *text, std::vector<Operators> &op, bool& need_value, std::vector<Instruction> &instrl,
                                     Script::ErrorType &errorType) {
    need_value = true;
    if (text[0] == '(') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        instrl.push_back(Instruction(InstrCode::INSTR_PUSH_ARGS));
        int i = 1, index = 0;
        union {
            int i;
            unsigned int ui;
        } tmp;
        bool need_arg = true;
        while (text[i] != ')') {
            if ((tmp.ui = ReadWhitespace(text + i)) > 0)
                i += (int)tmp.ui;
            else if (need_arg && (tmp.i = ReadExpression(text + i, instrl, errorType)) > 0) {
                i += tmp.i;
                need_arg = false;
                instrl.push_back(Instruction(InstrCode::INSTR_DEFINE_ARG, index++));
            }
            else if (tmp.i < 0)
                return tmp.i - i;
            else if (!need_arg && text[i] == ',') {
                i++;
                need_arg = true;
            }
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
                return -i;
            }
        }
        if (need_arg && index > 0) {
            errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
            return -i;
        }
        if (op.size() > 0 && op.back() == Operators::OP_NEW) {
            op.pop_back();
            instrl.push_back(Instruction(InstrCode::INSTR_VALUE_OBJECT));
        }
        else
            instrl.push_back(Instruction(InstrCode::INSTR_OP_CALL));
        need_value = false;
        return i + 1;
    }
    else if (text[0] == '[') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        int i = 1, tmp;
        i += (int)ReadWhitespace(text + i);
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        i += tmp;
        i += (int)ReadWhitespace(text + i);
        if (text[i] != ']') {
            errorType = Script::ErrorType::SCRPT_ERROR_BRACKET_CLOSE;
            return -i;
        }
        instrl.push_back(Instruction(InstrCode::INSTR_OP_ARRAY));
        need_value = false;
        return i + 1;
    }
    else if (text[0] == '.') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        int i = 1;
        i += (int)ReadWhitespace(text + i);
        unsigned int tmp;
        std::string name;
        if ((tmp = ReadName(text + i, name)) == 0) {
            errorType = Script::ErrorType::SCRPT_ERROR_NAME;
            return -i;
        }
        i += (int)tmp;
        instrl.push_back(Instruction(InstrCode::INSTR_OP_MEMBER, name.c_str()));
        need_value = false;
        return i;
    }
    else if (text[0] == '?') {
        while (op.size() > 0 && OP_Priority[op.back()] == OP_Priority[Operators::OP_ASSIGN])
            PopOperator(op, instrl);
        int i = 1, tmp, line_je = instrl.size();
        i += (int)ReadWhitespace(text + i);
        instrl.push_back(Instruction(InstrCode::INSTR_JUMP_ELSE));
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        i += tmp;
        i += (int)ReadWhitespace(text + i);
        int line_jt = instrl.size();
        instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
        instrl[line_je] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
        if (text[i] != ':') {
            errorType = Script::ErrorType::SCRPT_ERROR_COLON;
            return -i;
        }
        i += (int)ReadWhitespace(text + i);
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        instrl[line_jt] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
        i += tmp;
        return i;
    }
    else {
        switch (text[0]) {
            case '+':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_ADD_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_ADD, instrl);
                    return 1;
                }
            case '-':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_SUB_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_SUB, instrl);
                    return 1;
                }
            case '*':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_MUL_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_MUL, instrl);
                    return 1;
                }
            case '/':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_DIV_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_DIV, instrl);
                    return 1;
                }
            case '%':
                PushOperator(op, Operators::OP_MOD, instrl);
                return 1;
            case '=':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_EQU, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_ASSIGN, instrl);
                    return 1;
                }
            case '!':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_DIF, instrl);
                    return 2;
                }
                else {
                    errorType = Script::ErrorType::SCRPT_ERROR_OPERATOR;
                    return -1;
                }
            case '<':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_LESS_EQU, instrl);
                    return 2;
                }
                else if (text[1] == '<') {
                    PushOperator(op, Operators::OP_LSHIFT, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_LESS, instrl);
                    return 1;
                }
            case '>':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_GREAT_EQU, instrl);
                    return 2;
                }
                else if (text[1] == '>') {
                    PushOperator(op, Operators::OP_RSHIFT, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_GREAT, instrl);
                    return 1;
                }
            case '&':
                if (text[1] == '&') {
                    PushOperator(op, Operators::OP_AND, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_BIT_AND, instrl);
                    return 1;
                }
            case '|':
                if (text[1] == '|') {
                    PushOperator(op, Operators::OP_OR, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_BIT_OR, instrl);
                    return 1;
                }
            case '^':
                PushOperator(op, Operators::OP_BIT_XOR, instrl);
                return 1;
            default:
                need_value = false;
                return 0;
        }
    }
}